

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  bool bVar1;
  undefined1 in_DL;
  FieldDescriptor *in_RDI;
  long in_R8;
  Extension *extension;
  undefined8 in_stack_fffffffffffffec8;
  ExtensionSet *in_stack_fffffffffffffed0;
  Extension **in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff0c;
  ExtensionSet *in_stack_ffffffffffffff10;
  long *local_28;
  
  if (in_R8 == 0) {
    ClearExtension(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  }
  else {
    bVar1 = MaybeNewExtension(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_RDI,
                              in_stack_fffffffffffffef8);
    if (bVar1) {
      *(undefined1 *)(local_28 + 1) = in_DL;
      *(undefined1 *)((long)local_28 + 9) = 0;
      *(byte *)((long)local_28 + 10) = *(byte *)((long)local_28 + 10) & 0xf;
      *local_28 = in_R8;
    }
    else if ((*(byte *)((long)local_28 + 10) >> 4 & 1) == 0) {
      if ((*(long *)in_RDI == 0) && ((long *)*local_28 != (long *)0x0)) {
        (**(code **)(*(long *)*local_28 + 8))();
      }
      *local_28 = in_R8;
    }
    else {
      (**(code **)(*(long *)*local_28 + 0x30))((long *)*local_28,in_R8);
    }
    *(byte *)((long)local_28 + 10) = *(byte *)((long)local_28 + 10) & 0xf0;
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = message;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->UnsafeArenaSetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      extension->message_value = message;
    }
  }
  extension->is_cleared = false;
}